

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

void __thiscall
spvtools::opt::VectorDCE::MarkExtractUseAsLive
          (VectorDCE *this,Instruction *current_inst,BitVector *live_elements,
          LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *this_00;
  Instruction *inst;
  VectorDCE *this_01;
  WorkListItem new_item;
  
  this_00 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  uVar2 = Instruction::GetSingleWordInOperand(current_inst,0);
  inst = analysis::DefUseManager::GetDef(this_00,uVar2);
  bVar1 = HasVectorOrScalarResult(this,inst);
  if (bVar1) {
    WorkListItem::WorkListItem(&new_item);
    new_item.instruction = inst;
    uVar2 = Instruction::NumInOperands(current_inst);
    if (uVar2 < 2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&new_item.components.bits_,&live_elements->bits_);
    }
    else {
      uVar2 = Instruction::GetSingleWordInOperand(current_inst,1);
      uVar3 = Instruction::type_id(inst);
      uVar3 = GetVectorComponentCount(this,uVar3);
      if (uVar2 < uVar3) {
        utils::BitVector::Set(&new_item.components,uVar2);
      }
    }
    this_01 = (VectorDCE *)&stack0xffffffffffffffb0;
    WorkListItem::WorkListItem((WorkListItem *)&stack0xffffffffffffffb0,&new_item);
    AddItemToWorkListIfNeeded
              (this_01,(WorkListItem *)&stack0xffffffffffffffb0,live_components,work_list);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffffb8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&new_item.components);
  }
  return;
}

Assistant:

void VectorDCE::MarkExtractUseAsLive(const Instruction* current_inst,
                                     const utils::BitVector& live_elements,
                                     LiveComponentMap* live_components,
                                     std::vector<WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  uint32_t operand_id =
      current_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
  Instruction* operand_inst = def_use_mgr->GetDef(operand_id);

  if (HasVectorOrScalarResult(operand_inst)) {
    WorkListItem new_item;
    new_item.instruction = operand_inst;
    if (current_inst->NumInOperands() < 2) {
      new_item.components = live_elements;
    } else {
      uint32_t element_index = current_inst->GetSingleWordInOperand(1);
      uint32_t item_size = GetVectorComponentCount(operand_inst->type_id());
      if (element_index < item_size) {
        new_item.components.Set(element_index);
      }
    }
    AddItemToWorkListIfNeeded(new_item, live_components, work_list);
  }
}